

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMPhysicalUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char local_a8 [8];
  char line [128];
  FILE *file;
  int64_t result;
  int BufferSize;
  
  file = (FILE *)0x0;
  __stream = fopen("/proc/self/status","r");
  while (pcVar2 = fgets(local_a8,0x80,__stream), pcVar2 != (char *)0x0) {
    iVar1 = strncmp(local_a8,"VmRSS:",6);
    if (iVar1 == 0) {
      iVar1 = impl::ParseLine(local_a8);
      file = file + (long)iVar1 * 0x400;
    }
  }
  fclose(__stream);
  return (int64_t)file;
}

Assistant:

int64_t npas4::GetRAMPhysicalUsedByCurrentProcess()
{
#ifdef WIN32
	PROCESS_MEMORY_COUNTERS_EX pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), reinterpret_cast<PPROCESS_MEMORY_COUNTERS>(&pmc), sizeof(pmc));
	return static_cast<int64_t>(pmc.WorkingSetSize);
#else
	constexpr int BufferSize{128};
	int64_t result = 0;
	auto file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != nullptr)
	{
		if(strncmp(line, "VmRSS:", 6) == 0)
		{
			result += npas4::impl::ParseLine(line) * Kilobytes2Bytes;
		}
	}

	fclose(file);
	return static_cast<int64_t>(result);
#endif
}